

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

void initialize_resize_helper(natwm_state *state,xcb_rectangle_t *monitor_rect,client *client)

{
  xcb_window_t xVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar2;
  int local_40;
  int local_3c;
  xcb_configure_window_value_list_t values;
  uint16_t mask;
  uint16_t border_width;
  client *client_local;
  xcb_rectangle_t *monitor_rect_local;
  natwm_state *state_local;
  
  uVar2 = 0x1057d9;
  unique0x1000014f = client;
  if (state->button_state->resize_helper == 0) {
    natwm_state_lock(state);
    xVar1 = create_resize_helper(state);
    state->button_state->resize_helper = xVar1;
    natwm_state_unlock(state);
  }
  values.sibling._2_2_ =
       client_get_active_border_width(state->workspace_list->theme,stack0xffffffffffffffe0);
  values.sibling._0_2_ = 0x5f;
  local_40 = (int)(stack0xffffffffffffffe0->rect).x + (int)monitor_rect->x;
  local_3c = (int)(stack0xffffffffffffffe0->rect).y + (int)monitor_rect->y;
  values.x = (int32_t)(stack0xffffffffffffffe0->rect).width;
  values.y = (int32_t)(stack0xffffffffffffffe0->rect).height;
  values.width = (uint32_t)values.sibling._2_2_;
  values.height = 0;
  values.border_width = 0;
  xcb_configure_window_aux
            (state->xcb,state->button_state->resize_helper,0x5f,&local_40,in_R8,in_R9,uVar2);
  xcb_flush(state->xcb);
  return;
}

Assistant:

static void initialize_resize_helper(struct natwm_state *state, const xcb_rectangle_t *monitor_rect,
                                     const struct client *client)
{
        // On first resize the resize helper will not have been created yet
        if (state->button_state->resize_helper == XCB_NONE) {
                natwm_state_lock(state);

                state->button_state->resize_helper = create_resize_helper(state);

                natwm_state_unlock(state);
        }

        uint16_t border_width
                = client_get_active_border_width(state->workspace_list->theme, client);
        uint16_t mask = XCB_CONFIG_WINDOW_X | XCB_CONFIG_WINDOW_Y | XCB_CONFIG_WINDOW_WIDTH
                | XCB_CONFIG_WINDOW_HEIGHT | XCB_CONFIG_WINDOW_BORDER_WIDTH
                | XCB_CONFIG_WINDOW_STACK_MODE;
        xcb_configure_window_value_list_t values = {
                .x = (int32_t)(client->rect.x + monitor_rect->x),
                .y = (int32_t)(client->rect.y + monitor_rect->y),
                .width = client->rect.width,
                .height = client->rect.height,
                .border_width = border_width,
                .stack_mode = XCB_STACK_MODE_ABOVE,
        };

        xcb_configure_window_aux(state->xcb, state->button_state->resize_helper, mask, &values);

        xcb_flush(state->xcb);
}